

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

ServiceClient __thiscall
miniros::NodeHandle::serviceClient(NodeHandle *this,ServiceClientOptions *ops)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ServiceClient SVar5;
  string local_40;
  
  resolveName(&local_40,(NodeHandle *)ops,in_RDX,true);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ServiceClient::ServiceClient
            ((ServiceClient *)this,in_RDX,*(bool *)&in_RDX[2]._M_dataplus._M_p,
             (M_string *)&in_RDX[2]._M_string_length,in_RDX + 1);
  pvVar3 = ServiceClient::operator_cast_to_void_((ServiceClient *)this);
  _Var4._M_pi = extraout_RDX;
  if (pvVar3 != (void *)0x0) {
    lVar1 = *(long *)(ops + 0xa8);
    std::mutex::lock((mutex *)&((pthread_mutex_t *)(lVar1 + 0x60))->__data);
    lVar2 = *(long *)(ops + 0xa8);
    std::__weak_ptr<miniros::ServiceClient::Impl,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<miniros::ServiceClient::Impl,void>
              ((__weak_ptr<miniros::ServiceClient::Impl,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::
    vector<std::weak_ptr<miniros::ServiceClient::Impl>,std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>>>
    ::emplace_back<std::weak_ptr<miniros::ServiceClient::Impl>>
              ((vector<std::weak_ptr<miniros::ServiceClient::Impl>,std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>>>
                *)(lVar2 + 0x48),(weak_ptr<miniros::ServiceClient::Impl> *)&local_40);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
    pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x60));
    _Var4._M_pi = extraout_RDX_00;
  }
  SVar5.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  SVar5.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServiceClient)
         SVar5.impl_.super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceClient NodeHandle::serviceClient(ServiceClientOptions& ops)
{
  ops.service = resolveName(ops.service);
  ServiceClient client(ops.service, ops.persistent, ops.header, ops.md5sum);

  if (client)
  {
    std::scoped_lock<std::mutex> lock(collection_->mutex_);
    collection_->srv_cs_.push_back(client.impl_);
  }

  return client;
}